

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bssl_shim.cc
# Opt level: O3

bool DoExchange(UniquePtr<SSL_SESSION> *out_session,UniquePtr<SSL> *ssl_uniqueptr,TestConfig *config
               ,bool is_resume,bool is_retry,SettingsWriter *writer)

{
  byte bVar1;
  SSL *pSVar2;
  MockQuicTransport *this;
  pointer __p;
  SSL *pSVar3;
  uchar *ssl_00;
  bool bVar4;
  uint16_t uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  SSL_CTX *pSVar9;
  TestState *pTVar10;
  uint8_t *out;
  TestState *pTVar11;
  size_t sVar12;
  void *__s;
  SSL_SESSION *session;
  undefined7 in_register_00000009;
  long lVar13;
  int ret_code;
  size_t in_len;
  char *__format;
  ulong __n;
  bool is_resume_00;
  ulong uVar14;
  SSL *ssl;
  uchar local_cd;
  uint local_cc;
  Span<const_unsigned_char> write_secret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  uint16_t secret_len;
  undefined6 uStack_76;
  SSL_CTX *local_70;
  TestConfig *config_1;
  __uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  ulong local_38;
  
  uVar14 = CONCAT71(in_register_00000009,is_resume) & 0xffffffff;
  pSVar2 = (SSL *)(ssl_uniqueptr->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl;
  ssl = (SSL *)pSVar2;
  local_60 = (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)out_session;
  pSVar9 = (SSL_CTX *)SSL_get_SSL_CTX(pSVar2);
  pTVar10 = GetTestState((SSL *)pSVar2);
  if (config->implicit_handshake == false) {
    if (config->handoff == true) {
      bVar4 = DoSplitHandshake(ssl_uniqueptr,writer,SUB81(uVar14,0));
      if (!bVar4) {
        return false;
      }
      ssl = (ssl_uniqueptr->_M_t).super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl;
      pTVar10 = GetTestState(ssl);
    }
    local_cc = (uint)CONCAT71(in_register_00000009,is_resume);
    local_70 = pSVar9;
    do {
      local_58._8_8_ = 0;
      local_40 = std::
                 _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/test/bssl_shim.cc:998:59)>
                 ::_M_invoke;
      local_48 = std::
                 _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/test/bssl_shim.cc:998:59)>
                 ::_M_manager;
      local_58._M_unused._M_object = &ssl;
      iVar6 = CheckIdempotentError("SSL_do_handshake",ssl,(function<int_()> *)&local_58);
      if (local_48 != (code *)0x0) {
        (*local_48)(&local_58,&local_58,__destroy_functor);
      }
      bVar4 = RetryAsync(ssl,iVar6);
    } while (bVar4);
    if (config->forbid_renegotiation_after_handshake == true) {
      SSL_set_renegotiate_mode(ssl,ssl_renegotiate_never);
    }
    uVar14 = (ulong)local_cc;
    if (iVar6 != 1) {
      return false;
    }
    is_resume_00 = SUB41(local_cc,0);
    bVar4 = CheckHandshakeProperties(ssl,is_resume_00,config);
    if (!bVar4) {
      return false;
    }
    pSVar9 = (SSL_CTX *)SSL_get_SSL_CTX((SSL *)ssl);
    CopySessions(local_70,pSVar9);
    if ((((is_resume_00 == true && !is_retry) && (config->is_server == false)) &&
        (config->expect_no_offer_early_data == true)) &&
       (iVar6 = SSL_in_early_data(ssl), iVar6 != 0)) {
      DoExchange();
      return false;
    }
    if (config->handshake_twice == true) {
      do {
        iVar6 = SSL_do_handshake((SSL *)ssl);
        bVar4 = RetryAsync(ssl,iVar6);
      } while (bVar4);
      if (iVar6 != 1) {
        return false;
      }
    }
    if ((config->no_op_extra_handshake == true) &&
       (iVar6 = SSL_do_handshake((SSL *)ssl), iVar6 != 1)) {
      DoExchange();
      return false;
    }
    if (config->early_write_after_message != 0) {
      iVar6 = SSL_in_early_data(ssl);
      if ((iVar6 == 0) || (config->is_server == true)) {
        DoExchange();
        return false;
      }
      if ((config->shim_writes_first != true) || (config->async != true)) {
        DoExchange();
        return false;
      }
      do {
        iVar6 = SSL_do_handshake((SSL *)ssl);
        if (pTVar10->last_message_received == config->early_write_after_message) break;
        bVar4 = RetryAsync(ssl,iVar6);
      } while (bVar4);
      if (iVar6 == 1) {
        DoExchange();
        return false;
      }
      if (pTVar10->last_message_received != config->early_write_after_message) {
        return false;
      }
    }
    pTVar10->got_new_session = false;
  }
  if (0 < (long)config->export_keying_material) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&result,(long)config->export_keying_material,(allocator_type *)&write_secret);
    iVar6 = SSL_export_keying_material
                      ((SSL *)ssl,
                       result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       (long)result.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)result.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,
                       (config->export_label)._M_dataplus._M_p,
                       (config->export_label)._M_string_length,
                       (uchar *)(config->export_context)._M_dataplus._M_p,
                       (config->export_context)._M_string_length,(uint)config->use_export_context);
    if (iVar6 == 0) {
      DoExchange();
      return false;
    }
    iVar6 = WriteAll(ssl,result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                     (long)result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start);
    if (result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (iVar6 < 0) {
      return false;
    }
  }
  if (config->export_traffic_secrets == true) {
    result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    write_secret.data_ = (uchar *)0x0;
    write_secret.size_ = 0;
    bVar4 = bssl::SSL_get_traffic_secrets(ssl,(Span<const_unsigned_char> *)&result,&write_secret);
    if (!bVar4) {
      fwrite("failed to export traffic secrets\n",0x21,1,_stderr);
      return false;
    }
    if ((pointer)0xffff <
        result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      __assert_fail("read_secret.size() <= 0xffff",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/test/bssl_shim.cc"
                    ,0x449,
                    "bool DoExchange(bssl::UniquePtr<SSL_SESSION> *, bssl::UniquePtr<SSL> *, const TestConfig *, bool, bool, SettingsWriter *)"
                   );
    }
    if ((pointer)write_secret.size_ !=
        result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      __assert_fail("write_secret.size() == read_secret.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/test/bssl_shim.cc"
                    ,0x44a,
                    "bool DoExchange(bssl::UniquePtr<SSL_SESSION> *, bssl::UniquePtr<SSL> *, const TestConfig *, bool, bool, SettingsWriter *)"
                   );
    }
    _secret_len = (uint8_t *)
                  CONCAT62(uStack_76,
                           (short)result.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish);
    iVar6 = WriteAll(ssl,&secret_len,2);
    if (iVar6 < 0) {
      return false;
    }
    iVar6 = WriteAll(ssl,result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start,
                     (size_t)result.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish);
    if (iVar6 < 0) {
      return false;
    }
    iVar6 = WriteAll(ssl,write_secret.data_,write_secret.size_);
    if (iVar6 < 0) {
      return false;
    }
  }
  if (config->tls_unique == true) {
    iVar6 = SSL_get_tls_unique(ssl,(uint8_t *)&result,(size_t *)&write_secret,0x10);
    if (iVar6 == 0) {
      DoExchange();
      return false;
    }
    if (write_secret.data_ != (uchar *)0xc) {
      fprintf(_stderr,"expected 12 bytes of tls-unique but got %u");
      return false;
    }
    iVar6 = WriteAll(ssl,&result,0xc);
    if (iVar6 < 0) {
      return false;
    }
  }
  pSVar3 = ssl;
  if (config->send_alert == true) {
    do {
      iVar6 = SSL_send_fatal_alert(pSVar3,'\x1e');
      bVar4 = RetryAsync(pSVar3,iVar6);
    } while (bVar4);
    return -1 < iVar6;
  }
  if (config->write_different_record_sizes == true) {
    if (config->is_dtls == true) {
      DoExchange();
      return false;
    }
    out = (uint8_t *)operator_new__(0x8001);
    memset(out,0x42,0x8001);
    lVar13 = 0;
    do {
      iVar6 = WriteAll(ssl,out,*(size_t *)((long)DoExchange::kRecordSizes + lVar13));
      if (iVar6 < 0) {
LAB_00121b8b:
        operator_delete__(out);
        return false;
      }
      lVar13 = lVar13 + 8;
    } while (lVar13 != 0x58);
LAB_00121698:
    operator_delete__(out);
  }
  else {
    bVar1 = config->read_with_unfinished_write;
    if ((bool)bVar1 == true) {
      if (config->async == false) {
        DoExchange();
        return false;
      }
      if (config->is_quic == true) {
        DoExchange();
        return false;
      }
      AsyncBioAllowWrite(pTVar10->async_bio,1);
      iVar6 = SSL_write((SSL *)ssl,"hello",5);
      iVar6 = SSL_get_error((SSL *)ssl,iVar6);
      if (iVar6 != 3) {
        DoExchange();
        return false;
      }
    }
    else if ((config->shim_writes_first == true) && (iVar6 = WriteAll(ssl,"hello",5), iVar6 < 0)) {
      return false;
    }
    if (config->shim_shuts_down == false) {
      local_70 = (SSL_CTX *)(CONCAT71(local_70._1_7_,(char)uVar14) ^ 1);
      local_cc = (uint)uVar14;
      do {
        if ((config->key_update_before_read == true) && (iVar6 = SSL_key_update(ssl,0), iVar6 == 0))
        {
          DoExchange();
          return false;
        }
        pSVar3 = ssl;
        __n = 0x200;
        if (config->is_dtls != false) {
          __n = 0x4000;
        }
        if (0 < (long)config->read_size) {
          __n = (long)config->read_size;
        }
        out = (uint8_t *)operator_new__(__n);
        memset(out,0,__n);
        write_secret.data_ = (uchar *)pSVar3;
        _secret_len = out;
        local_38 = __n;
        config_1 = GetTestConfig(pSVar3);
        pTVar11 = GetTestState(pSVar3);
        this = (pTVar11->quic_transport)._M_t.
               super___uniq_ptr_impl<MockQuicTransport,_std::default_delete<MockQuicTransport>_>.
               _M_t.
               super__Tuple_impl<0UL,_MockQuicTransport_*,_std::default_delete<MockQuicTransport>_>.
               super__Head_base<0UL,_MockQuicTransport_*,_false>._M_head_impl;
        uVar14 = (ulong)local_cc;
        if (this == (MockQuicTransport *)0x0) {
          do {
            ssl_00 = write_secret.data_;
            result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)operator_new(0x20);
            *(TestConfig ***)
             result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start = &config_1;
            *(Span<const_unsigned_char> **)
             ((long)result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    .super__Vector_impl_data._M_start + 8) = &write_secret;
            *(uint16_t **)
             ((long)result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    .super__Vector_impl_data._M_start + 0x10) = &secret_len;
            *(ulong **)
             ((long)result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                    .super__Vector_impl_data._M_start + 0x18) = &local_38;
            result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)std::
                          _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/test/bssl_shim.cc:216:58)>
                          ::_M_manager;
            uVar8 = CheckIdempotentError
                              ("SSL_peek/SSL_read",(SSL *)ssl_00,(function<int_()> *)&result);
            in_len = (size_t)uVar8;
            if (result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
              (*(code *)result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage)
                        ((function<int_()> *)&result,(function<int_()> *)&result,3);
            }
            if ((config_1->use_exporter_between_reads == true) &&
               (iVar6 = SSL_export_keying_material
                                  ((SSL *)write_secret.data_,&local_cd,1,(char *)0x0,0,(uchar *)0x0,
                                   0,0), iVar6 == 0)) {
              DoExchange();
              in_len = 0xffffffff;
              goto LAB_0012189d;
            }
            bVar4 = RetryAsync((SSL *)write_secret.data_,uVar8);
          } while (bVar4);
          if ((0 < (int)uVar8) && (config_1->peek_then_read != false)) {
            uVar14 = (ulong)uVar8;
            __s = operator_new__(uVar14);
            memset(__s,0,uVar14);
            uVar7 = SSL_peek((SSL *)write_secret.data_,__s,uVar8);
            if ((uVar7 == uVar8) && (iVar6 = bcmp(__s,_secret_len,uVar14), iVar6 == 0)) {
              uVar7 = SSL_read((SSL *)write_secret.data_,__s,uVar8);
              if ((uVar7 == uVar8) && (iVar6 = bcmp(__s,_secret_len,uVar14), iVar6 == 0)) {
                operator_delete__(__s);
                goto LAB_00121898;
              }
              DoExchange();
            }
            else {
              DoExchange();
            }
            operator_delete__(__s);
            in_len = 0xffffffff;
            goto LAB_00121898;
          }
        }
        else {
          uVar8 = MockQuicTransport::ReadApplicationData(this,out,__n);
          in_len = (size_t)uVar8;
LAB_00121898:
          uVar14 = (ulong)local_cc;
        }
LAB_0012189d:
        ret_code = (int)in_len;
        iVar6 = SSL_get_error((SSL *)ssl,ret_code);
        if (iVar6 == 6) {
          if (ret_code == 0) goto LAB_00121698;
          DoExchange();
          goto LAB_00121b8b;
        }
        if (iVar6 == 5 && ret_code == 0) goto LAB_00121698;
        if (iVar6 != 0) {
          if (0 < ret_code) {
            DoExchange();
          }
          goto LAB_00121b8b;
        }
        if (ret_code < 1) {
          DoExchange();
          goto LAB_00121b8b;
        }
        if (((config->is_server == false && (char)local_70 == '\0') && !is_retry) &&
           (config->expect_reject_early_data == true)) {
          DoExchange();
          goto LAB_00121b8b;
        }
        if ((pTVar10->handshake_done == false) && (iVar6 = SSL_early_data_accepted(ssl), iVar6 == 0)
           ) {
          DoExchange();
          goto LAB_00121b8b;
        }
        if (((bVar1 & 1) != 0) && (iVar6 = WriteAll(ssl,"hello",5), iVar6 < 0)) goto LAB_00121b8b;
        if ((config->key_update == true) && (iVar6 = SSL_key_update(ssl,0), iVar6 == 0)) {
          DoExchange();
          goto LAB_00121b8b;
        }
        sVar12 = 0;
        do {
          out[sVar12] = ~out[sVar12];
          sVar12 = sVar12 + 1;
        } while (in_len != sVar12);
        iVar6 = WriteAll(ssl,out,in_len);
        if (iVar6 < 0) goto LAB_00121b8b;
        operator_delete__(out);
        bVar1 = 0;
      } while( true );
    }
  }
  if ((((config->is_server == false) && (config->false_start == false)) &&
      (config->implicit_handshake == false)) &&
     ((uVar5 = GetProtocolVersion(ssl), uVar5 < 0x304 && (pTVar10->got_new_session == true)))) {
    DoExchange();
    return false;
  }
  pSVar3 = ssl;
  uVar7 = SSL_version((SSL *)ssl);
  iVar6 = SSL_is_dtls(pSVar3);
  uVar8 = 0x200 - uVar7;
  if (iVar6 == 0) {
    uVar8 = uVar7;
  }
  if ((0x303 < (uVar8 & 0xffff)) && (config->is_server == false)) {
    if ((config->expect_no_session == false) && (config->shim_shuts_down == false)) {
      bVar4 = IsPAKE(ssl);
      bVar4 = !bVar4;
    }
    else {
      bVar4 = false;
    }
    if (pTVar10->got_new_session != bVar4) {
      DoExchange();
      return false;
    }
    if (bVar4 != false) {
      iVar6 = SSL_SESSION_early_data_capable
                        ((pTVar10->new_session)._M_t.
                         super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl);
      if (config->expect_ticket_supports_early_data != (iVar6 != 0)) {
        DoExchange();
        return false;
      }
      if ((config->expect_resumable_across_names).super__Optional_base<bool,_true,_true>._M_payload.
          super__Optional_payload_base<bool>._M_engaged == true) {
        iVar6 = SSL_SESSION_is_resumable_across_names
                          ((pTVar10->new_session)._M_t.
                           super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl);
        if ((config->expect_resumable_across_names).super__Optional_base<bool,_true,_true>.
            _M_payload.super__Optional_payload_base<bool>._M_engaged == false) {
          std::__throw_bad_optional_access();
        }
        if ((config->expect_resumable_across_names).super__Optional_base<bool,_true,_true>.
            _M_payload.super__Optional_payload_base<bool>._M_payload._M_value != (iVar6 != 0)) {
          DoExchange();
          return false;
        }
      }
    }
  }
  pSVar2 = (SSL *)ssl;
  if (local_60 != (__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)0x0) {
    __p = (pTVar10->new_session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>
          ._M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
    (pTVar10->new_session)._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl = (ssl_session_st *)0x0;
    std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset(local_60,__p);
    pSVar2 = (SSL *)ssl;
  }
  do {
    uVar8 = SSL_shutdown(pSVar2);
    bVar4 = RetryAsync((SSL *)pSVar2,uVar8);
  } while (bVar4);
  if ((config->shim_shuts_down == true) && (config->check_close_notify == true)) {
    if (uVar8 != 0) {
      __format = "Unexpected SSL_shutdown result: %d != 0\n";
      goto LAB_00121d80;
    }
    uVar8 = DoShutdown(ssl);
  }
  if (uVar8 == 1) {
    iVar6 = SSL_total_renegotiations(ssl);
    if (0 < iVar6) {
      session = SSL_get_session((SSL *)ssl);
      iVar6 = SSL_SESSION_is_resumable((SSL_SESSION *)session);
      if (iVar6 != 0) {
        DoExchange();
        return false;
      }
      iVar6 = SSL_session_reused(ssl);
      if (iVar6 != 0) {
        DoExchange();
        return false;
      }
      bVar4 = CheckAuthProperties(ssl,SUB81(uVar14,0),config);
      if (!bVar4) {
        return false;
      }
    }
    iVar6 = SSL_total_renegotiations(ssl);
    if (iVar6 == config->expect_total_renegotiations) {
      if (config->renegotiate_explicit != true) {
        return true;
      }
      iVar6 = SSL_total_renegotiations(ssl);
      if (iVar6 == pTVar10->explicit_renegotiates) {
        return true;
      }
      DoExchange();
    }
    else {
      DoExchange();
    }
    return false;
  }
  __format = "Unexpected SSL_shutdown result: %d != 1\n";
LAB_00121d80:
  fprintf(_stderr,__format,(ulong)uVar8);
  return false;
}

Assistant:

static bool DoExchange(bssl::UniquePtr<SSL_SESSION> *out_session,
                       bssl::UniquePtr<SSL> *ssl_uniqueptr,
                       const TestConfig *config, bool is_resume, bool is_retry,
                       SettingsWriter *writer) {
  int ret;
  SSL *ssl = ssl_uniqueptr->get();
  SSL_CTX *session_ctx = SSL_get_SSL_CTX(ssl);
  TestState *test_state = GetTestState(ssl);

  if (!config->implicit_handshake) {
    if (config->handoff) {
#if defined(HANDSHAKER_SUPPORTED)
      if (!DoSplitHandshake(ssl_uniqueptr, writer, is_resume)) {
        return false;
      }
      ssl = ssl_uniqueptr->get();
      test_state = GetTestState(ssl);
#else
      fprintf(stderr, "The external handshaker can only be used on Linux\n");
      return false;
#endif
    }

    do {
      ret = CheckIdempotentError("SSL_do_handshake", ssl, [&]() -> int {
        return SSL_do_handshake(ssl);
      });
    } while (RetryAsync(ssl, ret));

    if (config->forbid_renegotiation_after_handshake) {
      SSL_set_renegotiate_mode(ssl, ssl_renegotiate_never);
    }

    if (ret != 1 || !CheckHandshakeProperties(ssl, is_resume, config)) {
      return false;
    }

    CopySessions(session_ctx, SSL_get_SSL_CTX(ssl));

    if (is_resume && !is_retry && !config->is_server &&
        config->expect_no_offer_early_data && SSL_in_early_data(ssl)) {
      fprintf(stderr, "Client unexpectedly offered early data.\n");
      return false;
    }

    if (config->handshake_twice) {
      do {
        ret = SSL_do_handshake(ssl);
      } while (RetryAsync(ssl, ret));
      if (ret != 1) {
        return false;
      }
    }

    // Skip the |config->async| logic as this should be a no-op.
    if (config->no_op_extra_handshake && SSL_do_handshake(ssl) != 1) {
      fprintf(stderr, "Extra SSL_do_handshake was not a no-op.\n");
      return false;
    }

    if (config->early_write_after_message != 0) {
      if (!SSL_in_early_data(ssl) || config->is_server) {
        fprintf(stderr,
                "-early-write-after-message only works for 0-RTT connections "
                "on servers.\n");
        return false;
      }
      if (!config->shim_writes_first || !config->async) {
        fprintf(stderr,
                "-early-write-after-message requires -shim-writes-first and "
                "-async.\n");
        return false;
      }
      // Run the handshake until the specified message. Note that, if a
      // handshake record contains multiple messages, |SSL_do_handshake| usually
      // processes both atomically. The test must ensure there is a record
      // boundary after the desired message. Checking |last_message_received|
      // confirms this.
      do {
        ret = SSL_do_handshake(ssl);
      } while (test_state->last_message_received !=
                   config->early_write_after_message &&
               RetryAsync(ssl, ret));
      if (ret == 1) {
        fprintf(stderr, "Handshake unexpectedly succeeded.\n");
        return false;
      }
      if (test_state->last_message_received !=
          config->early_write_after_message) {
        // The handshake failed before we saw the target message. The generic
        // error-handling logic in the caller will print the error.
        return false;
      }
    }

    // Reset the state to assert later that the callback isn't called in
    // renegotations.
    test_state->got_new_session = false;
  }

  if (config->export_keying_material > 0) {
    std::vector<uint8_t> result(
        static_cast<size_t>(config->export_keying_material));
    if (!SSL_export_keying_material(
            ssl, result.data(), result.size(), config->export_label.data(),
            config->export_label.size(),
            reinterpret_cast<const uint8_t *>(config->export_context.data()),
            config->export_context.size(), config->use_export_context)) {
      fprintf(stderr, "failed to export keying material\n");
      return false;
    }
    if (WriteAll(ssl, result.data(), result.size()) < 0) {
      return false;
    }
  }

  if (config->export_traffic_secrets) {
    bssl::Span<const uint8_t> read_secret, write_secret;
    if (!SSL_get_traffic_secrets(ssl, &read_secret, &write_secret)) {
      fprintf(stderr, "failed to export traffic secrets\n");
      return false;
    }

    assert(read_secret.size() <= 0xffff);
    assert(write_secret.size() == read_secret.size());
    const uint16_t secret_len = read_secret.size();
    if (WriteAll(ssl, &secret_len, sizeof(secret_len)) < 0 ||
        WriteAll(ssl, read_secret.data(), read_secret.size()) < 0 ||
        WriteAll(ssl, write_secret.data(), write_secret.size()) < 0) {
      return false;
    }
  }

  if (config->tls_unique) {
    uint8_t tls_unique[16];
    size_t tls_unique_len;
    if (!SSL_get_tls_unique(ssl, tls_unique, &tls_unique_len,
                            sizeof(tls_unique))) {
      fprintf(stderr, "failed to get tls-unique\n");
      return false;
    }

    if (tls_unique_len != 12) {
      fprintf(stderr, "expected 12 bytes of tls-unique but got %u",
              static_cast<unsigned>(tls_unique_len));
      return false;
    }

    if (WriteAll(ssl, tls_unique, tls_unique_len) < 0) {
      return false;
    }
  }

  if (config->send_alert) {
    if (DoSendFatalAlert(ssl, SSL_AD_DECOMPRESSION_FAILURE) < 0) {
      return false;
    }
    return true;
  }

  if (config->write_different_record_sizes) {
    if (config->is_dtls) {
      fprintf(stderr, "write_different_record_sizes not supported for DTLS\n");
      return false;
    }
    // This mode writes a number of different record sizes in an attempt to
    // trip up the CBC record splitting code.
    static const size_t kBufLen = 32769;
    auto buf = std::make_unique<uint8_t[]>(kBufLen);
    OPENSSL_memset(buf.get(), 0x42, kBufLen);
    static const size_t kRecordSizes[] = {
        0, 1, 255, 256, 257, 16383, 16384, 16385, 32767, 32768, 32769};
    for (size_t i = 0; i < OPENSSL_ARRAY_SIZE(kRecordSizes); i++) {
      const size_t len = kRecordSizes[i];
      if (len > kBufLen) {
        fprintf(stderr, "Bad kRecordSizes value.\n");
        return false;
      }
      if (WriteAll(ssl, buf.get(), len) < 0) {
        return false;
      }
    }
  } else {
    static const char kInitialWrite[] = "hello";
    bool pending_initial_write = false;
    if (config->read_with_unfinished_write) {
      if (!config->async) {
        fprintf(stderr, "-read-with-unfinished-write requires -async.\n");
        return false;
      }
      if (config->is_quic) {
        fprintf(stderr,
                "-read-with-unfinished-write is incompatible with QUIC.\n");
        return false;
      }

      // Let only one byte of the record through.
      AsyncBioAllowWrite(test_state->async_bio, 1);
      int write_ret = SSL_write(ssl, kInitialWrite, strlen(kInitialWrite));
      if (SSL_get_error(ssl, write_ret) != SSL_ERROR_WANT_WRITE) {
        fprintf(stderr, "Failed to leave unfinished write.\n");
        return false;
      }
      pending_initial_write = true;
    } else if (config->shim_writes_first) {
      if (WriteAll(ssl, kInitialWrite, strlen(kInitialWrite)) < 0) {
        return false;
      }
    }
    if (!config->shim_shuts_down) {
      for (;;) {
        if (config->key_update_before_read &&
            !SSL_key_update(ssl, SSL_KEY_UPDATE_NOT_REQUESTED)) {
          fprintf(stderr, "SSL_key_update failed.\n");
          return false;
        }

        // Read only 512 bytes at a time in TLS to ensure records may be
        // returned in multiple reads.
        size_t read_size = config->is_dtls ? 16384 : 512;
        if (config->read_size > 0) {
          read_size = config->read_size;
        }
        auto buf = std::make_unique<uint8_t[]>(read_size);

        int n = DoRead(ssl, buf.get(), read_size);
        int err = SSL_get_error(ssl, n);
        if (err == SSL_ERROR_ZERO_RETURN ||
            (n == 0 && err == SSL_ERROR_SYSCALL)) {
          if (n != 0) {
            fprintf(stderr, "Invalid SSL_get_error output\n");
            return false;
          }
          // Stop on either clean or unclean shutdown.
          break;
        } else if (err != SSL_ERROR_NONE) {
          if (n > 0) {
            fprintf(stderr, "Invalid SSL_get_error output\n");
            return false;
          }
          return false;
        }
        // Successfully read data.
        if (n <= 0) {
          fprintf(stderr, "Invalid SSL_get_error output\n");
          return false;
        }

        if (!config->is_server && is_resume && !is_retry &&
            config->expect_reject_early_data) {
          fprintf(stderr,
                  "Unexpectedly received data instead of 0-RTT reject.\n");
          return false;
        }

        // After a successful read, with or without False Start, the handshake
        // must be complete unless we are doing early data.
        if (!test_state->handshake_done && !SSL_early_data_accepted(ssl)) {
          fprintf(stderr, "handshake was not completed after SSL_read\n");
          return false;
        }

        // Clear the initial write, if unfinished.
        if (pending_initial_write) {
          if (WriteAll(ssl, kInitialWrite, strlen(kInitialWrite)) < 0) {
            return false;
          }
          pending_initial_write = false;
        }

        if (config->key_update &&
            !SSL_key_update(ssl, SSL_KEY_UPDATE_NOT_REQUESTED)) {
          fprintf(stderr, "SSL_key_update failed.\n");
          return false;
        }

        for (int i = 0; i < n; i++) {
          buf[i] ^= 0xff;
        }
        if (WriteAll(ssl, buf.get(), n) < 0) {
          return false;
        }
      }
    }
  }

  if (!config->is_server && !config->false_start &&
      !config->implicit_handshake &&
      // Session tickets are sent post-handshake in TLS 1.3.
      GetProtocolVersion(ssl) < TLS1_3_VERSION && test_state->got_new_session) {
    fprintf(stderr, "new session was established after the handshake\n");
    return false;
  }

  if (GetProtocolVersion(ssl) >= TLS1_3_VERSION && !config->is_server) {
    bool expect_new_session =
        !config->expect_no_session && !config->shim_shuts_down && !IsPAKE(ssl);
    if (expect_new_session != test_state->got_new_session) {
      fprintf(stderr,
              "new session was%s cached, but we expected the opposite\n",
              test_state->got_new_session ? "" : " not");
      return false;
    }

    if (expect_new_session) {
      bool got_early_data =
          !!SSL_SESSION_early_data_capable(test_state->new_session.get());
      if (config->expect_ticket_supports_early_data != got_early_data) {
        fprintf(stderr,
                "new session did%s support early data, but we expected the "
                "opposite\n",
                got_early_data ? "" : " not");
        return false;
      }

      if (config->expect_resumable_across_names.has_value()) {
        bool actual = !!SSL_SESSION_is_resumable_across_names(
            test_state->new_session.get());
        if (config->expect_resumable_across_names.value() != actual) {
          fprintf(stderr,
                  "new session did%s support cross-name resumption, but we "
                  "expected the opposite\n",
                  actual ? "" : " not");
          return false;
        }
      }
    }
  }

  if (out_session) {
    *out_session = std::move(test_state->new_session);
  }

  ret = DoShutdown(ssl);

  if (config->shim_shuts_down && config->check_close_notify) {
    // We initiate shutdown, so |SSL_shutdown| will return in two stages. First
    // it returns zero when our close_notify is sent, then one when the peer's
    // is received.
    if (ret != 0) {
      fprintf(stderr, "Unexpected SSL_shutdown result: %d != 0\n", ret);
      return false;
    }
    ret = DoShutdown(ssl);
  }

  if (ret != 1) {
    fprintf(stderr, "Unexpected SSL_shutdown result: %d != 1\n", ret);
    return false;
  }

  if (SSL_total_renegotiations(ssl) > 0) {
    if (SSL_SESSION_is_resumable(SSL_get_session(ssl))) {
      fprintf(stderr,
              "Renegotiations should never produce resumable sessions.\n");
      return false;
    }

    if (SSL_session_reused(ssl)) {
      fprintf(stderr, "Renegotiations should never resume sessions.\n");
      return false;
    }

    // Re-check authentication properties after a renegotiation. The reported
    // values should remain unchanged even if the server sent different SCT
    // lists.
    if (!CheckAuthProperties(ssl, is_resume, config)) {
      return false;
    }
  }

  if (SSL_total_renegotiations(ssl) != config->expect_total_renegotiations) {
    fprintf(stderr, "Expected %d renegotiations, got %d\n",
            config->expect_total_renegotiations, SSL_total_renegotiations(ssl));
    return false;
  }

  if (config->renegotiate_explicit &&
      SSL_total_renegotiations(ssl) != test_state->explicit_renegotiates) {
    fprintf(stderr, "Performed %d renegotiations, but triggered %d of them\n",
            SSL_total_renegotiations(ssl), test_state->explicit_renegotiates);
    return false;
  }

  return true;
}